

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

bool __thiscall
testing::internal::
CartesianProductGenerator<google::protobuf::io::(anonymous_namespace)::VarintCase,_int>::
IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL>_>::AtEnd
          (IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL>_> *this)

{
  bool bVar1;
  __tuple_element_t<0UL,_tuple<ParamIterator<VarintCase>,_ParamIterator<int>_>_> *this_00;
  __tuple_element_t<0UL,_tuple<ParamIterator<VarintCase>,_ParamIterator<int>_>_> *other;
  __tuple_element_t<1UL,_tuple<ParamIterator<VarintCase>,_ParamIterator<int>_>_> *this_01;
  __tuple_element_t<1UL,_tuple<ParamIterator<VarintCase>,_ParamIterator<int>_>_> *other_00;
  bool local_29;
  bool dummy [2];
  bool at_end;
  IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL>_> *this_local;
  
  this_00 = std::
            get<0ul,testing::internal::ParamIterator<google::protobuf::io::(anonymous_namespace)::VarintCase>,testing::internal::ParamIterator<int>>
                      (&this->current_);
  other = std::
          get<0ul,testing::internal::ParamIterator<google::protobuf::io::(anonymous_namespace)::VarintCase>,testing::internal::ParamIterator<int>>
                    (&this->end_);
  bVar1 = ParamIterator<google::protobuf::io::(anonymous_namespace)::VarintCase>::operator==
                    (this_00,other);
  local_29 = true;
  if (!bVar1) {
    this_01 = std::
              get<1ul,testing::internal::ParamIterator<google::protobuf::io::(anonymous_namespace)::VarintCase>,testing::internal::ParamIterator<int>>
                        (&this->current_);
    other_00 = std::
               get<1ul,testing::internal::ParamIterator<google::protobuf::io::(anonymous_namespace)::VarintCase>,testing::internal::ParamIterator<int>>
                         (&this->end_);
    local_29 = ParamIterator<int>::operator==(this_01,other_00);
  }
  return local_29;
}

Assistant:

bool AtEnd() const {
      bool at_end = false;
      bool dummy[] = {
          (at_end = at_end || std::get<I>(current_) == std::get<I>(end_))...};
      (void)dummy;
      return at_end;
    }